

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameOfLife.h
# Opt level: O3

void __thiscall
GameOfLife::GameOfLife(GameOfLife *this,vector<Point,_std::allocator<Point>_> *alivePoints)

{
  std::vector<Point,_std::allocator<Point>_>::vector(&this->aliveCells,alivePoints);
  (this->aliveCharacter)._M_dataplus._M_p = (pointer)&(this->aliveCharacter).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->aliveCharacter,"X","");
  (this->deadCharacter)._M_dataplus._M_p = (pointer)&(this->deadCharacter).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->deadCharacter,".","");
  return;
}

Assistant:

explicit GameOfLife(std::vector<Point>& alivePoints) : aliveCells(alivePoints)
    {
    }